

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_suite.cpp
# Opt level: O0

void custom_suite::from_enum(void)

{
  bool v;
  string_enumeration *in_RDX;
  type local_70;
  undefined4 local_3c;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> result;
  
  local_3c = 0x2a;
  trial::dynamic::convert::
  into<trial::dynamic::basic_variable<std::allocator<char>>,string_enumeration>
            ((basic_variable<std::allocator<char>_> *)local_38,(convert *)&local_3c,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>
                ((basic_variable<std::allocator<char>> *)local_38);
  boost::detail::test_impl
            ("result.same<std::string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0xab,"void custom_suite::from_enum()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_70,(basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result.value<string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0xac,"void custom_suite::from_enum()",&local_70,"alpha");
  std::__cxx11::string::~string((string *)&local_70);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void from_enum()
{
    auto result = convert::into<variable>(string_enumeration::alpha);
    TRIAL_PROTOCOL_TEST(result.same<std::string>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<string>(), "alpha");
}